

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

int __thiscall kj::ReadableDirectory::lstat(ReadableDirectory *this,char *__file,stat *__buf)

{
  PathPtr path_local;
  Fault f;
  _func_int **local_78;
  _func_int **pp_Stack_70;
  _func_int **local_68;
  _func_int **pp_Stack_60;
  _func_int **local_58;
  _func_int **pp_Stack_50;
  
  path_local.parts.ptr = (String *)__buf;
  (**(code **)(*(long *)__file + 0x48))(&f);
  if ((char)f.exception == '\x01') {
    this[4].super_FsNode._vptr_FsNode = local_58;
    this[5].super_FsNode._vptr_FsNode = pp_Stack_50;
    this[2].super_FsNode._vptr_FsNode = local_68;
    this[3].super_FsNode._vptr_FsNode = pp_Stack_60;
    (this->super_FsNode)._vptr_FsNode = local_78;
    this[1].super_FsNode._vptr_FsNode = pp_Stack_70;
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],kj::PathPtr&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x222,FAILED,(char *)0x0,"\"no such file or directory\", path",
               (char (*) [26])"no such file or directory",&path_local);
    kj::_::Debug::Fault::~Fault(&f);
    this[4].super_FsNode._vptr_FsNode = (_func_int **)0x0;
    this[5].super_FsNode._vptr_FsNode = (_func_int **)0x0;
    this[2].super_FsNode._vptr_FsNode = (_func_int **)0x0;
    this[3].super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_FsNode)._vptr_FsNode = (_func_int **)0x0;
    this[1].super_FsNode._vptr_FsNode = (_func_int **)0x0;
    *(undefined4 *)&this[4].super_FsNode._vptr_FsNode = 1;
    this[5].super_FsNode._vptr_FsNode = (_func_int **)0x0;
  }
  return (int)this;
}

Assistant:

FsNode::Metadata ReadableDirectory::lstat(PathPtr path) const {
  KJ_IF_SOME(meta, tryLstat(path)) {
    return meta;
  } else {
    KJ_FAIL_REQUIRE("no such file or directory", path) { break; }